

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

DistributionMapping __thiscall PeleLM::getFuncCountDM(PeleLM *this,BoxArray *bxba,int ngrow)

{
  double dVar1;
  bool bVar2;
  CpOp op;
  Long LVar3;
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::FArrayBox> *this_01;
  long lVar4;
  long *plVar5;
  FabArray<amrex::FArrayBox> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  element_type *in_RDI;
  DistributionMapping DVar6;
  int unaff_retaddr;
  int unaff_retaddr_00;
  MultiFab *in_stack_00000008;
  MFIter mfi;
  Vector<long,_std::allocator<long>_> vwrk;
  int count;
  MultiFab *FC;
  MultiFab fctmpnew;
  DistributionMapping rr;
  DistributionMapping *res;
  undefined1 *val;
  MFIter *mfi_00;
  AmrLevel *in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce8;
  int numcomp;
  int in_stack_fffffffffffffcec;
  undefined4 in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  BoxArray *in_stack_fffffffffffffcf8;
  MFInfo *in_stack_fffffffffffffd00;
  uchar flags_;
  undefined8 in_stack_fffffffffffffd08;
  FabArrayBase *fabarray_;
  undefined1 sort;
  int in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  int iVar7;
  undefined1 do_full_knapsack;
  BoxArray *in_stack_fffffffffffffd18;
  FabArrayBase *efficiency;
  MultiFab *in_stack_fffffffffffffd20;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffd28;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffffd30;
  DistributionMapping *this_02;
  undefined1 *puVar8;
  FabArray<amrex::FArrayBox> *this_03;
  Periodicity *period;
  MFIter local_288;
  undefined1 local_221 [73];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  Periodicity local_30;
  int local_1c;
  FabArray<amrex::FArrayBox> *local_18;
  element_type *peVar9;
  undefined2 uVar10;
  
  period = &local_30;
  local_18 = in_RDX;
  peVar9 = in_RDI;
  amrex::DistributionMapping::DistributionMapping((DistributionMapping *)0x51b28b);
  uVar10 = (undefined2)((ulong)peVar9 >> 0x30);
  LVar3 = amrex::BoxArray::size((BoxArray *)0x51b298);
  op = (CpOp)LVar3;
  amrex::ParallelDescriptor::NProcs();
  amrex::DistributionMapping::RoundRobinProcessorMap
            ((DistributionMapping *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             in_stack_fffffffffffffcec,in_stack_fffffffffffffce8,
             SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_221._57_8_ = 0;
  local_221._65_8_ = 0;
  local_1c8 = 0;
  this_03 = (FabArray<amrex::FArrayBox> *)(local_221 + 0x39);
  amrex::MFInfo::MFInfo((MFInfo *)0x51b2ff);
  local_221._49_8_ = 0;
  val = local_221 + 0x31;
  amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffce0);
  puVar8 = val;
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (DistributionMapping *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),(int)in_stack_fffffffffffffd08,
             in_stack_fffffffffffffd00,in_stack_fffffffffffffd30);
  amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x51b35e);
  amrex::MFInfo::~MFInfo((MFInfo *)0x51b36b);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffce0,(value_type)val);
  local_221._41_8_ =
       amrex::AmrLevel::get_new_data(in_stack_fffffffffffffce0,(int)((ulong)val >> 0x20));
  this_02 = (DistributionMapping *)
            amrex::MultiFab::norm0
                      (in_stack_00000008,unaff_retaddr_00,unaff_retaddr,SUB21((ushort)uVar10 >> 8,0)
                       ,SUB21(uVar10,0));
  if (0.0 < (double)this_02) {
    efficiency = (FabArrayBase *)local_221._41_8_;
    local_221._29_4_ = amrex::FabArrayBase::nGrow((FabArrayBase *)local_221._41_8_,0);
    this_00 = (FabArray<amrex::FArrayBox> *)std::min<int>(&local_1c,(int *)(local_221 + 0x1d));
    iVar7 = *(int *)&(this_00->super_FabArrayBase)._vptr_FabArrayBase;
    this_01 = (FabArray<amrex::FArrayBox> *)amrex::Periodicity::NonPeriodic();
    numcomp = 0;
    mfi_00 = (MFIter *)((ulong)val & 0xffffffff00000000);
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy
              (this_03,local_18,(int)((ulong)puVar8 >> 0x20),(int)puVar8,
               (int)((ulong)this_02 >> 0x20),(int)this_02,in_ESI,period,op);
    local_221._25_4_ = 0;
    LVar3 = amrex::BoxArray::size((BoxArray *)0x51b52a);
    flags_ = (uchar)((ulong)LVar3 >> 0x38);
    fabarray_ = (FabArrayBase *)local_221;
    std::allocator<long>::allocator((allocator<long> *)0x51b541);
    amrex::Vector<long,_std::allocator<long>_>::vector
              ((Vector<long,_std::allocator<long>_> *)this_01,(size_type)mfi_00,
               (allocator_type *)0x51b558);
    std::allocator<long>::~allocator((allocator<long> *)0x51b567);
    amrex::MFIter::MFIter((MFIter *)CONCAT44(iVar7,in_stack_fffffffffffffd10),fabarray_,flags_);
    while( true ) {
      bVar2 = amrex::MFIter::isValid(&local_288);
      do_full_knapsack = (undefined1)((uint)iVar7 >> 0x18);
      sort = (undefined1)((ulong)fabarray_ >> 0x38);
      if (!bVar2) break;
      amrex::FabArray<amrex::FArrayBox>::operator[](this_01,mfi_00);
      dVar1 = amrex::BaseFab<double>::sum<(amrex::RunOn)1>
                        ((BaseFab<double> *)
                         CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                         in_stack_fffffffffffffcec,numcomp);
      lVar4 = (long)dVar1;
      local_221._25_4_ = local_221._25_4_ + 1;
      plVar5 = amrex::Vector<long,_std::allocator<long>_>::operator[]
                         ((Vector<long,_std::allocator<long>_> *)this_01,(size_type)mfi_00);
      *plVar5 = lVar4;
      amrex::MFIter::operator++(&local_288);
    }
    local_221._33_4_ = 2;
    amrex::MFIter::~MFIter((MFIter *)this_01);
    amrex::FabArray<amrex::FArrayBox>::clear(this_00);
    iVar7 = (int)((ulong)this_00 >> 0x20);
    amrex::DistributionMapping::DistributionMapping((DistributionMapping *)0x51b67b);
    amrex::ParallelDescriptor::NProcs();
    std::numeric_limits<int>::max();
    amrex::DistributionMapping::KnapSackProcessorMap
              (this_02,in_stack_fffffffffffffd28,iVar7,(Real *)efficiency,(bool)do_full_knapsack,
               in_stack_fffffffffffffd10,(bool)sort);
    local_221._33_4_ = 1;
    amrex::Vector<long,_std::allocator<long>_>::~Vector
              ((Vector<long,_std::allocator<long>_> *)0x51b70f);
  }
  else {
    local_221[0x28] = 0;
    amrex::ParallelDescriptor::NProcs();
    amrex::DistributionMapping::DistributionMapping
              ((DistributionMapping *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               in_stack_fffffffffffffcf4);
    local_221[0x28] = 1;
    local_221._33_4_ = 1;
  }
  amrex::MultiFab::~MultiFab((MultiFab *)0x51b72d);
  amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0x51b73a);
  DVar6.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  DVar6.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (DistributionMapping)
         DVar6.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

DistributionMapping
PeleLM::getFuncCountDM (const BoxArray& bxba, int ngrow)
{
  //
  // Sometimes "mf" is the valid region of the State.
  // Sometimes it's the region covered by AuxBoundaryData.
  // When ngrow>0 were doing AuxBoundaryData with nGrow()==ngrow.
  //
  DistributionMapping rr;
  rr.RoundRobinProcessorMap(bxba.size(),ParallelDescriptor::NProcs());

  MultiFab fctmpnew(bxba, rr, 1, 0);
  fctmpnew.setVal(1);

  const MultiFab& FC = get_new_data(FuncCount_Type);

  // Return original DM if FC is zero (propably Null reaction dir)
  if ( FC.norm0(0) <= 0.0 ) {
     DistributionMapping new_dmap{bxba};
     return new_dmap;
  }

  fctmpnew.ParallelCopy(FC,0,0,1,std::min(ngrow,FC.nGrow()),0);

  int count = 0;
  Vector<long> vwrk(bxba.size());

// FIXME need to be tiled
  for (MFIter mfi(fctmpnew); mfi.isValid(); ++mfi)
     vwrk[count++] = static_cast<long>(fctmpnew[mfi].sum<RunOn::Host>(0));

  fctmpnew.clear();

#ifdef AMREX_USE_MPI
  const int IOProc = ParallelDescriptor::IOProcessorNumber();

  Vector<int> nmtags(ParallelDescriptor::NProcs(),0);
  Vector<int> offset(ParallelDescriptor::NProcs(),0);

  const Vector<int>& procmap = rr.ProcessorMap();

  for (long int i = 0; i < vwrk.size(); i++)
    nmtags[procmap[i]]++;

  AMREX_ASSERT(nmtags[ParallelDescriptor::MyProc()] == count);

  for (long int i = 1; i < offset.size(); i++)
    offset[i] = offset[i-1] + nmtags[i-1];

  Vector<long> vwrktmp;

  if (ParallelDescriptor::IOProcessor()) vwrktmp = vwrk;

  MPI_Gatherv(vwrk.dataPtr(),
              count,
              ParallelDescriptor::Mpi_typemap<long>::type(),
              ParallelDescriptor::IOProcessor() ? vwrktmp.dataPtr() : 0,
              nmtags.dataPtr(),
              offset.dataPtr(),
              ParallelDescriptor::Mpi_typemap<long>::type(),
              IOProc,
              ParallelDescriptor::Communicator());

  if (ParallelDescriptor::IOProcessor())
  {
    //
    // We must now assemble vwrk in the proper order.
    //
    Vector< Vector<int> > table(ParallelDescriptor::NProcs());

    for (long int i = 0; i < vwrk.size(); i++)
      table[procmap[i]].push_back(i);

    int idx = 0;
    for (long int i = 0; i < table.size(); i++)
    {
      Vector<int>& tbl = table[i];
      for (long int j = 0; j < tbl.size(); j++)
        vwrk[tbl[j]] = vwrktmp[idx++];
    }
  }

  vwrktmp.clear();
  //
  // Send the properly-ordered vwrk to all processors.
  //
  ParallelDescriptor::Bcast(vwrk.dataPtr(), vwrk.size(), IOProc);
#endif

  DistributionMapping res;

  res.KnapSackProcessorMap(vwrk,ParallelDescriptor::NProcs());

  return res;
}